

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::SPPParameter::Clear(SPPParameter *this)

{
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    this->engine_ = 0;
    this->pyramid_height_ = 0;
    this->pool_ = 0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void SPPParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.SPPParameter)
  if (_has_bits_[0 / 32] & 7u) {
    ::memset(&pyramid_height_, 0, reinterpret_cast<char*>(&engine_) -
      reinterpret_cast<char*>(&pyramid_height_) + sizeof(engine_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}